

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_uintwide_t_n_binary_ops_template.h
# Opt level: O3

void __thiscall
test_uintwide_t_n_binary_ops_template<64U,_unsigned_int,_void>::initialize
          (test_uintwide_t_n_binary_ops_template<64U,_unsigned_int,_void> *this)

{
  pointer puVar1;
  pointer pnVar2;
  
  puVar1 = (this->a_local).
           super__Vector_base<math::wide_integer::uintwide_t<64U,_unsigned_int,_void,_false>,_std::allocator<math::wide_integer::uintwide_t<64U,_unsigned_int,_void,_false>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if ((this->a_local).
      super__Vector_base<math::wide_integer::uintwide_t<64U,_unsigned_int,_void,_false>,_std::allocator<math::wide_integer::uintwide_t<64U,_unsigned_int,_void,_false>_>_>
      ._M_impl.super__Vector_impl_data._M_finish != puVar1) {
    (this->a_local).
    super__Vector_base<math::wide_integer::uintwide_t<64U,_unsigned_int,_void,_false>,_std::allocator<math::wide_integer::uintwide_t<64U,_unsigned_int,_void,_false>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = puVar1;
  }
  puVar1 = (this->b_local).
           super__Vector_base<math::wide_integer::uintwide_t<64U,_unsigned_int,_void,_false>,_std::allocator<math::wide_integer::uintwide_t<64U,_unsigned_int,_void,_false>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if ((this->b_local).
      super__Vector_base<math::wide_integer::uintwide_t<64U,_unsigned_int,_void,_false>,_std::allocator<math::wide_integer::uintwide_t<64U,_unsigned_int,_void,_false>_>_>
      ._M_impl.super__Vector_impl_data._M_finish != puVar1) {
    (this->b_local).
    super__Vector_base<math::wide_integer::uintwide_t<64U,_unsigned_int,_void,_false>,_std::allocator<math::wide_integer::uintwide_t<64U,_unsigned_int,_void,_false>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = puVar1;
  }
  pnVar2 = (this->a_boost).
           super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_int_backend<64U,_64U,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void>,_(boost::multiprecision::expression_template_option)1>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_int_backend<64U,_64U,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void>,_(boost::multiprecision::expression_template_option)1>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if ((this->a_boost).
      super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_int_backend<64U,_64U,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void>,_(boost::multiprecision::expression_template_option)1>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_int_backend<64U,_64U,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void>,_(boost::multiprecision::expression_template_option)1>_>_>
      ._M_impl.super__Vector_impl_data._M_finish != pnVar2) {
    (this->a_boost).
    super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_int_backend<64U,_64U,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void>,_(boost::multiprecision::expression_template_option)1>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_int_backend<64U,_64U,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void>,_(boost::multiprecision::expression_template_option)1>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = pnVar2;
  }
  pnVar2 = (this->b_boost).
           super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_int_backend<64U,_64U,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void>,_(boost::multiprecision::expression_template_option)1>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_int_backend<64U,_64U,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void>,_(boost::multiprecision::expression_template_option)1>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if ((this->b_boost).
      super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_int_backend<64U,_64U,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void>,_(boost::multiprecision::expression_template_option)1>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_int_backend<64U,_64U,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void>,_(boost::multiprecision::expression_template_option)1>_>_>
      ._M_impl.super__Vector_impl_data._M_finish != pnVar2) {
    (this->b_boost).
    super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_int_backend<64U,_64U,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void>,_(boost::multiprecision::expression_template_option)1>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_int_backend<64U,_64U,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void>,_(boost::multiprecision::expression_template_option)1>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = pnVar2;
  }
  std::
  vector<math::wide_integer::uintwide_t<64U,_unsigned_int,_void,_false>,_std::allocator<math::wide_integer::uintwide_t<64U,_unsigned_int,_void,_false>_>_>
  ::resize(&this->a_local,
           (this->super_test_uintwide_t_n_binary_ops_base).super_test_uintwide_t_n_base.
           number_of_cases);
  std::
  vector<math::wide_integer::uintwide_t<64U,_unsigned_int,_void,_false>,_std::allocator<math::wide_integer::uintwide_t<64U,_unsigned_int,_void,_false>_>_>
  ::resize(&this->b_local,
           (this->super_test_uintwide_t_n_binary_ops_base).super_test_uintwide_t_n_base.
           number_of_cases);
  std::
  vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_int_backend<64U,_64U,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void>,_(boost::multiprecision::expression_template_option)1>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_int_backend<64U,_64U,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void>,_(boost::multiprecision::expression_template_option)1>_>_>
  ::resize(&this->a_boost,
           (this->super_test_uintwide_t_n_binary_ops_base).super_test_uintwide_t_n_base.
           number_of_cases);
  std::
  vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_int_backend<64U,_64U,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void>,_(boost::multiprecision::expression_template_option)1>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_int_backend<64U,_64U,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void>,_(boost::multiprecision::expression_template_option)1>_>_>
  ::resize(&this->b_boost,
           (this->super_test_uintwide_t_n_binary_ops_base).super_test_uintwide_t_n_base.
           number_of_cases);
  test_uintwide_t_n_base::
  get_equal_random_test_values_boost_and_local_n<math::wide_integer::uintwide_t<64u,unsigned_int,void,false>,boost::multiprecision::number<boost::multiprecision::backends::cpp_int_backend<64u,64u,(boost::multiprecision::cpp_integer_type)0,(boost::multiprecision::cpp_int_check_type)0,void>,(boost::multiprecision::expression_template_option)1>,void>
            ((this->a_local).
             super__Vector_base<math::wide_integer::uintwide_t<64U,_unsigned_int,_void,_false>,_std::allocator<math::wide_integer::uintwide_t<64U,_unsigned_int,_void,_false>_>_>
             ._M_impl.super__Vector_impl_data._M_start,
             (this->a_boost).
             super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_int_backend<64U,_64U,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void>,_(boost::multiprecision::expression_template_option)1>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_int_backend<64U,_64U,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void>,_(boost::multiprecision::expression_template_option)1>_>_>
             ._M_impl.super__Vector_impl_data._M_start,
             (this->super_test_uintwide_t_n_binary_ops_base).super_test_uintwide_t_n_base.
             number_of_cases);
  test_uintwide_t_n_base::
  get_equal_random_test_values_boost_and_local_n<math::wide_integer::uintwide_t<64u,unsigned_int,void,false>,boost::multiprecision::number<boost::multiprecision::backends::cpp_int_backend<64u,64u,(boost::multiprecision::cpp_integer_type)0,(boost::multiprecision::cpp_int_check_type)0,void>,(boost::multiprecision::expression_template_option)1>,void>
            ((this->b_local).
             super__Vector_base<math::wide_integer::uintwide_t<64U,_unsigned_int,_void,_false>,_std::allocator<math::wide_integer::uintwide_t<64U,_unsigned_int,_void,_false>_>_>
             ._M_impl.super__Vector_impl_data._M_start,
             (this->b_boost).
             super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_int_backend<64U,_64U,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void>,_(boost::multiprecision::expression_template_option)1>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_int_backend<64U,_64U,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void>,_(boost::multiprecision::expression_template_option)1>_>_>
             ._M_impl.super__Vector_impl_data._M_start,
             (this->super_test_uintwide_t_n_binary_ops_base).super_test_uintwide_t_n_base.
             number_of_cases);
  return;
}

Assistant:

auto initialize() -> void override
    {
      a_local.clear();
      b_local.clear();

      a_boost.clear();
      b_boost.clear();

      a_local.resize(size());
      b_local.resize(size());

      a_boost.resize(size());
      b_boost.resize(size());

      get_equal_random_test_values_boost_and_local_n<local_uint_type, boost_uint_type, AllocatorType>(a_local.data(), a_boost.data(), size());
      get_equal_random_test_values_boost_and_local_n<local_uint_type, boost_uint_type, AllocatorType>(b_local.data(), b_boost.data(), size());
    }